

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O3

bool deqp::egl::notColorBits<8,8,8,8>(CandidateConfig *c)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = eglu::CandidateConfig::redSize(c);
  bVar2 = true;
  if (iVar1 == 8) {
    iVar1 = eglu::CandidateConfig::greenSize(c);
    if (iVar1 == 8) {
      iVar1 = eglu::CandidateConfig::blueSize(c);
      if (iVar1 == 8) {
        iVar1 = eglu::CandidateConfig::alphaSize(c);
        bVar2 = iVar1 != 8;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool notColorBits (const eglu::CandidateConfig& c)
{
	return c.redSize()		!= Red		||
		   c.greenSize()	!= Green	||
		   c.blueSize()		!= Blue		||
		   c.alphaSize()	!= Alpha;
}